

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeOneCE
          (CollationDataBuilder *this,int64_t ce,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t index_00;
  int32_t index;
  uint32_t ce32;
  UErrorCode *errorCode_local;
  int64_t ce_local;
  CollationDataBuilder *this_local;
  
  this_local._4_4_ = encodeOneCEAsCE32(ce);
  if (this_local._4_4_ == 1) {
    index_00 = addCE(this,ce,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 == '\0') {
      if (index_00 < 0x80000) {
        this_local._4_4_ = Collation::makeCE32FromTagIndexAndLength(6,index_00,1);
      }
      else {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationDataBuilder::encodeOneCE(int64_t ce, UErrorCode &errorCode) {
    // Try to encode one CE as one CE32.
    uint32_t ce32 = encodeOneCEAsCE32(ce);
    if(ce32 != Collation::NO_CE32) { return ce32; }
    int32_t index = addCE(ce, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(index > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION_TAG, index, 1);
}